

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O2

Vec_Wrd_t * Abc_SuppReadMin(char *pFileName,int *pnVars)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  undefined4 extraout_var;
  Vec_Wrd_t *p;
  size_t sVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong Entry;
  
  pcVar3 = Extra_FileReadContents(pFileName);
  if (pcVar3 == (char *)0x0) {
    pcVar3 = "Cannot open input file (%s).\n";
  }
  else {
    pcVar4 = strstr(pcVar3,"INPUT F-COVER");
    if (pcVar4 != (char *)0x0) {
      pcVar4 = strtok(pcVar4 + 0xd," \t\r\n,");
      iVar1 = atoi(pcVar4);
      if (iVar1 - 0xf4241U < 0xfff0bdc0) {
        puts("The number of cubes in not in the range [1; 1000000].");
        return (Vec_Wrd_t *)0x0;
      }
      p = Vec_WrdAlloc(1000);
      uVar7 = 0xffffffffffffffff;
      do {
        uVar8 = 0;
        Entry = 0;
        while( true ) {
          pcVar4 = strtok((char *)0x0," \t\r\n,");
          iVar6 = (int)uVar7;
          if (pcVar4 == (char *)0x0) goto LAB_003d7109;
          sVar5 = strlen(pcVar4);
          if (2 < sVar5) break;
          if (pcVar4[1] == '1') {
            if (*pcVar4 != '0') goto LAB_003d70ed;
          }
          else {
            if ((pcVar4[1] != '0') || (*pcVar4 != '1')) {
LAB_003d70ed:
              printf("Strange literal representation (%s) of cube %d.\n",pcVar4,
                     CONCAT44(extraout_var,iVar1));
              goto LAB_003d714c;
            }
            Entry = Entry | 1L << (uVar8 & 0x3f);
          }
          uVar8 = uVar8 + 1;
        }
        iVar2 = strncmp(pcVar4,"INPUT",5);
        if (iVar2 == 0) {
LAB_003d7109:
          free(pcVar3);
          if (p->nSize == iVar1) {
            printf("Successfully parsed function with %d inputs and %d cubes.\n",uVar7 & 0xffffffff)
            ;
            *pnVars = iVar6;
            return p;
          }
          printf("The number of cubes (%d) does not match declaration (%d).\n");
          goto LAB_003d714c;
        }
        if (0x40 < uVar8) {
          printf("The number of inputs (%d) is too high.\n",uVar8 & 0xffffffff);
          goto LAB_003d714c;
        }
        if (iVar6 == -1) {
          uVar7 = uVar8 & 0xffffffff;
        }
        else if (iVar6 != (int)uVar8) {
          printf("The number of inputs (%d) does not match declaration (%d).\n",uVar7 & 0xffffffff,
                 uVar8 & 0xffffffff);
LAB_003d714c:
          Vec_WrdFree(p);
          return (Vec_Wrd_t *)0x0;
        }
        Vec_WrdPush(p,Entry);
      } while( true );
    }
    pcVar3 = "Cannot find beginning of cube cover (%s).\n";
    pFileName = "INPUT F-COVER";
  }
  printf(pcVar3,pFileName);
  return (Vec_Wrd_t *)0x0;
}

Assistant:

Vec_Wrd_t * Abc_SuppReadMin( char * pFileName, int * pnVars )
{
    Vec_Wrd_t * vRes; word uCube;
    int nCubes = 0, nVars = -1, iVar;
    char * pCur, * pToken, * pStart = "INPUT F-COVER";
    char * pStr = Extra_FileReadContents( pFileName );
    if ( pStr == NULL )
        { printf( "Cannot open input file (%s).\n", pFileName ); return NULL; }
    pCur = strstr( pStr, pStart );
    if ( pCur == NULL )
        { printf( "Cannot find beginning of cube cover (%s).\n", pStart ); return NULL; }
    pToken = strtok( pCur + strlen(pStart), " \t\r\n," );
    nCubes = atoi( pToken );
    if ( nCubes < 1 || nCubes > 1000000 )
        { printf( "The number of cubes in not in the range [1; 1000000].\n" ); return NULL; }
    vRes = Vec_WrdAlloc( 1000 );
    uCube = 0; iVar = 0;
    while ( (pToken = strtok(NULL, " \t\r\n,")) != NULL )
    {
        if ( strlen(pToken) > 2 )
        {
            if ( !strncmp(pToken, "INPUT", strlen("INPUT")) )
                break;
            if ( iVar > 64 )
                { printf( "The number of inputs (%d) is too high.\n", iVar ); Vec_WrdFree(vRes); return NULL; }
            if ( nVars == -1 )
                nVars = iVar;
            else if ( nVars != iVar )
                { printf( "The number of inputs (%d) does not match declaration (%d).\n", nVars, iVar ); Vec_WrdFree(vRes); return NULL; }
            Vec_WrdPush( vRes, uCube );
            uCube = 0; iVar = 0;
            continue;
        }
        if ( pToken[1] == '0' && pToken[0] == '1' ) // value 1
            uCube |= (((word)1) << iVar);
        else if ( pToken[1] != '1' || pToken[0] != '0' ) // value 0
            { printf( "Strange literal representation (%s) of cube %d.\n", pToken, nCubes ); Vec_WrdFree(vRes); return NULL; }
        iVar++;
    }
    ABC_FREE( pStr );
    if ( Vec_WrdSize(vRes) != nCubes )
        { printf( "The number of cubes (%d) does not match declaration (%d).\n", Vec_WrdSize(vRes), nCubes ); Vec_WrdFree(vRes); return NULL; }
    else
        printf( "Successfully parsed function with %d inputs and %d cubes.\n", nVars, nCubes );
    *pnVars = nVars;
    return vRes;
}